

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereShape.cpp
# Opt level: O3

cbtVector3 __thiscall cbtSphereShape::localGetSupportingVertex(cbtSphereShape *this,cbtVector3 *vec)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  float in_XMM1_Da;
  float fVar9;
  cbtVector3 cVar10;
  
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x11])();
  fVar8 = vec->m_floats[1];
  cVar1 = vec->m_floats[0];
  cVar2 = vec->m_floats[2];
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),ZEXT416((uint)cVar1),ZEXT416((uint)cVar1))
  ;
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)cVar2),ZEXT416((uint)cVar2));
  bVar4 = auVar3._0_4_ < 1.4210855e-14;
  fVar5 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * (int)cVar1);
  fVar6 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * (int)fVar8);
  fVar7 = (float)((uint)bVar4 * -0x40800000 + (uint)!bVar4 * (int)cVar2);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar5),ZEXT416((uint)fVar5))
  ;
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  auVar3 = vsqrtss_avx(auVar3,auVar3);
  fVar9 = 1.0 / auVar3._0_4_;
  fVar8 = fVar7 * fVar9;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3 = vmovshdup_avx(auVar3);
  auVar3 = vinsertps_avx(ZEXT416((uint)((float)in_XMM0_Qa + fVar8 * fVar5 * fVar9)),
                         ZEXT416((uint)(auVar3._0_4_ + fVar8 * fVar6 * fVar9)),0x10);
  cVar10.m_floats._0_8_ = auVar3._0_8_;
  cVar10.m_floats[2] = in_XMM1_Da + fVar8 * fVar7 * fVar9;
  cVar10.m_floats[3] = 0.0;
  return (cbtVector3)cVar10.m_floats;
}

Assistant:

cbtVector3 cbtSphereShape::localGetSupportingVertex(const cbtVector3& vec) const
{
	cbtVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	cbtVector3 vecnorm = vec;
	if (vecnorm.length2() < (SIMD_EPSILON * SIMD_EPSILON))
	{
		vecnorm.setValue(cbtScalar(-1.), cbtScalar(-1.), cbtScalar(-1.));
	}
	vecnorm.normalize();
	supVertex += getMargin() * vecnorm;
	return supVertex;
}